

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_key.cpp
# Opt level: O1

ARTKey __thiscall
duckdb::ARTKey::CreateARTKey<duckdb::string_t>
          (ARTKey *this,ArenaAllocator *allocator,string_t value)

{
  long lVar1;
  data_ptr_t data;
  ulong uVar2;
  idx_t len;
  ulong uVar3;
  long lVar4;
  undefined8 local_38;
  long local_30;
  ARTKey local_28;
  
  local_30 = value.value._0_8_;
  lVar4 = value.value._0_8_;
  if (((ulong)allocator & 0xffffffff) < 0xd) {
    lVar4 = (long)&local_38 + 4;
  }
  lVar1 = 0;
  uVar3 = (ulong)allocator & 0xffffffff;
  if (uVar3 != 0) {
    uVar2 = 0;
    do {
      lVar1 = lVar1 + (ulong)(*(byte *)(lVar4 + uVar2) < 2);
      uVar2 = uVar2 + 1;
    } while (uVar3 != uVar2);
  }
  len = uVar3 + lVar1 + 1;
  local_38 = allocator;
  data = ArenaAllocator::Allocate((ArenaAllocator *)this,len);
  if (uVar3 == 0) {
    lVar1 = 0;
  }
  else {
    uVar2 = 0;
    lVar1 = 0;
    do {
      if (*(byte *)(lVar4 + uVar2) < 2) {
        data[lVar1] = '\x01';
        lVar1 = lVar1 + 1;
      }
      data[lVar1] = *(data_t *)(lVar4 + uVar2);
      lVar1 = lVar1 + 1;
      uVar2 = uVar2 + 1;
    } while (uVar3 != uVar2);
  }
  data[lVar1] = '\0';
  ARTKey(&local_28,data,len);
  return local_28;
}

Assistant:

ARTKey ARTKey::CreateARTKey(ArenaAllocator &allocator, string_t value) {
	auto string_data = const_data_ptr_cast(value.GetData());
	auto string_len = value.GetSize();

	// We escape \00 and \01.
	idx_t escape_count = 0;
	for (idx_t i = 0; i < string_len; i++) {
		if (string_data[i] <= 1) {
			escape_count++;
		}
	}

	idx_t key_len = string_len + escape_count + 1;
	auto key_data = allocator.Allocate(key_len);

	// Copy over the data and add escapes.
	idx_t pos = 0;
	for (idx_t i = 0; i < string_len; i++) {
		if (string_data[i] <= 1) {
			// Add escape.
			key_data[pos++] = '\01';
		}
		key_data[pos++] = string_data[i];
	}

	// End with a null-terminator.
	key_data[pos] = '\0';
	return ARTKey(key_data, key_len);
}